

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

void * master_thread(void *thread_func_param)

{
  undefined8 *puVar1;
  pollfd *pfd;
  pthread_t __th;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  time_t tVar5;
  int *piVar6;
  char *pcVar7;
  int *piVar8;
  uint line;
  undefined4 *__optval;
  stop_flag_t *psVar9;
  long lVar10;
  mg_context *ctx;
  char *func;
  char *func_00;
  char *func_01;
  char *func_02;
  stop_flag_t *psVar11;
  ulong uVar12;
  long lVar13;
  socklen_t len;
  socket so;
  char src_addr [50];
  socklen_t local_19c;
  pthread_mutex_t *local_198;
  undefined4 local_18c;
  undefined1 local_188 [8];
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined1 local_168 [24];
  undefined1 auStack_150 [5];
  undefined1 uStack_14b;
  undefined2 uStack_14a;
  int *local_140;
  pthread_cond_t *local_138;
  pthread_cond_t *local_130;
  undefined4 local_128 [4];
  undefined8 local_118;
  char local_108 [64];
  _union_1457 local_c8;
  undefined1 local_c0 [144];
  
  memset(local_c0,0,0x90);
  local_c8 = (_union_1457)0x1;
  sigaction(0xd,(sigaction *)&local_c8,(sigaction *)0x0);
  if (thread_func_param != (void *)0x0) {
    mg_set_thread_name("master");
    local_128[0] = 1;
    pthread_setspecific(sTlsKey,local_128);
    if (*(code **)((long)thread_func_param + 0x28388) == (code *)0x0) {
      local_118 = 0;
    }
    else {
      local_118 = (**(code **)((long)thread_func_param + 0x28388))();
    }
    tVar5 = time((time_t *)0x0);
    *(time_t *)((long)thread_func_param + 0x282e0) = tVar5;
    pfd = *(pollfd **)((long)thread_func_param + 0x10);
    piVar6 = (int *)((long)thread_func_param + 0x28);
    if (*(int *)((long)thread_func_param + 0x28) == 0) {
      local_198 = (pthread_mutex_t *)((long)thread_func_param + 0x30);
      local_130 = (pthread_cond_t *)((long)thread_func_param + 0xb8);
      local_138 = (pthread_cond_t *)((long)thread_func_param + 0x88);
      local_140 = piVar6;
      do {
        uVar4 = *(uint *)((long)thread_func_param + 0x18);
        if ((ulong)uVar4 != 0) {
          lVar13 = *(long *)((long)thread_func_param + 8);
          lVar10 = 0;
          do {
            *(undefined4 *)((long)&pfd->fd + lVar10) = *(undefined4 *)(lVar13 + lVar10 * 8);
            *(undefined2 *)((long)&pfd->events + lVar10) = 1;
            lVar10 = lVar10 + 8;
          } while ((ulong)uVar4 * 8 - lVar10 != 0);
        }
        psVar9 = piVar6;
        iVar3 = mg_poll(pfd,uVar4,200,piVar6);
        if ((0 < iVar3) && (uVar4 = *(uint *)((long)thread_func_param + 0x18), uVar4 != 0)) {
          psVar11 = (stop_flag_t *)0x0;
          do {
            line = (uint)psVar9;
            if ((*piVar6 == 0) && ((pfd[(long)psVar11].revents & 1) != 0)) {
              lVar13 = *(long *)((long)thread_func_param + 8);
              local_19c = 0x1c;
              local_18c = 1;
              local_188 = (undefined1  [8])0x0;
              uStack_180 = 0;
              local_178 = 0;
              uStack_170 = 0;
              local_168._0_2_ = 0;
              local_168[2] = '\0';
              local_168[3] = '\0';
              local_168[4] = '\0';
              local_168[5] = '\0';
              local_168[6] = '\0';
              local_168[7] = '\0';
              local_168[8] = '\0';
              local_168[9] = '\0';
              local_168[10] = '\0';
              local_168[0xb] = '\0';
              local_168[0xc] = '\0';
              local_168[0xd] = '\0';
              local_168[0xe] = '\0';
              local_168[0xf] = '\0';
              local_168._16_8_ = 0;
              _auStack_150 = 0;
              iVar3 = accept(*(int *)(lVar13 + (long)psVar11 * 0x40),(sockaddr *)local_168,
                             &local_19c);
              local_188._0_4_ = iVar3;
              if (iVar3 != -1) {
                iVar3 = check_acl((mg_context *)thread_func_param,(usa *)local_168);
                if (iVar3 == 1) {
                  lVar13 = lVar13 + (long)psVar11 * 0x40;
                  set_close_on_exec(local_188._0_4_,(mg_connection *)thread_func_param,ctx);
                  uVar2 = _auStack_150;
                  uStack_14a = SUB82(uVar2,6);
                  _auStack_150 = CONCAT15(*(undefined1 *)(lVar13 + 0x3d),
                                          CONCAT14(*(undefined1 *)(lVar13 + 0x3c),auStack_150._0_4_)
                                         );
                  iVar3 = getsockname(local_188._0_4_,(sockaddr *)(local_188 + 4),&local_19c);
                  if (iVar3 != 0) {
                    piVar6 = __errno_location();
                    pcVar7 = strerror(*piVar6);
                    mg_cry_internal_wrap
                              ((mg_connection *)0x0,(mg_context *)thread_func_param,func,line,
                               "%s: getsockname() failed: %s","accept_new_connection",pcVar7);
                  }
                  piVar6 = local_140;
                  if ((local_188._4_2_ & 0xfff7) == 2) {
                    __optval = &local_18c;
                    iVar3 = setsockopt(local_188._0_4_,1,9,__optval,4);
                    uVar4 = (uint)__optval;
                    if (iVar3 != 0) {
                      piVar8 = __errno_location();
                      pcVar7 = strerror(*piVar8);
                      mg_cry_internal_wrap
                                ((mg_connection *)0x0,(mg_context *)thread_func_param,func_00,uVar4,
                                 "%s: setsockopt(SOL_SOCKET SO_KEEPALIVE) failed: %s",
                                 "accept_new_connection",pcVar7);
                    }
                  }
                  pcVar7 = *(char **)((long)thread_func_param + 0x283c8);
                  if (((pcVar7 != (char *)0x0) && (*pcVar7 == '1')) && (pcVar7[1] == '\0')) {
                    local_108[0] = '\x01';
                    local_108[1] = '\0';
                    local_108[2] = '\0';
                    local_108[3] = '\0';
                    if ((local_188._4_2_ | 8) == 10) {
                      pcVar7 = local_108;
                      iVar3 = setsockopt(local_188._0_4_,6,1,pcVar7,4);
                      uVar4 = (uint)pcVar7;
                      if (iVar3 != 0) {
                        piVar8 = __errno_location();
                        pcVar7 = strerror(*piVar8);
                        mg_cry_internal_wrap
                                  ((mg_connection *)0x0,(mg_context *)thread_func_param,func_02,
                                   uVar4,"%s: setsockopt(IPPROTO_TCP TCP_NODELAY) failed: %s",
                                   "accept_new_connection",pcVar7);
                      }
                    }
                  }
                  set_non_blocking_mode(local_188._0_4_);
                  _auStack_150 = (uint7)_auStack_150;
                  pthread_mutex_lock(local_198);
                  while ((iVar3 = *(int *)((long)thread_func_param + 0x80) -
                                  *(int *)((long)thread_func_param + 0x84),
                         *(int *)((long)thread_func_param + 0x28) == 0 &&
                         (*(int *)((long)thread_func_param + 0xec) <= iVar3))) {
                    *(undefined4 *)((long)thread_func_param + 0xe8) = 1;
                    pthread_cond_wait(local_130,local_198);
                    *(undefined4 *)((long)thread_func_param + 0xe8) = 0;
                  }
                  if (iVar3 < *(int *)((long)thread_func_param + 0xec)) {
                    lVar13 = *(long *)((long)thread_func_param + 0x78);
                    lVar10 = (long)(*(int *)((long)thread_func_param + 0x80) %
                                   *(int *)((long)thread_func_param + 0xec)) * 0x40;
                    puVar1 = (undefined8 *)(lVar13 + 0x30 + lVar10);
                    *puVar1 = local_168._16_8_;
                    puVar1[1] = _auStack_150;
                    puVar1 = (undefined8 *)(lVar13 + 0x20 + lVar10);
                    *puVar1 = local_168._0_8_;
                    *(undefined8 *)(puVar1 + 1) = local_168._8_8_;
                    puVar1 = (undefined8 *)(lVar13 + 0x10 + lVar10);
                    *puVar1 = local_178;
                    puVar1[1] = uStack_170;
                    *(undefined8 *)(lVar13 + lVar10) = local_188;
                    ((undefined8 *)(lVar13 + lVar10))[1] = uStack_180;
                    *(int *)((long)thread_func_param + 0x80) =
                         *(int *)((long)thread_func_param + 0x80) + 1;
                  }
                  pthread_cond_signal(local_138);
                  pthread_mutex_unlock(local_198);
                }
                else {
                  sockaddr_to_string(local_108,0x32,(usa *)local_168);
                  mg_cry_internal_wrap
                            ((mg_connection *)0x0,(mg_context *)thread_func_param,func_01,line,
                             "%s: %s is not allowed to connect","accept_new_connection",local_108);
                  close(local_188._0_4_);
                  piVar6 = local_140;
                }
              }
              uVar4 = *(uint *)((long)thread_func_param + 0x18);
            }
            psVar11 = (stop_flag_t *)((long)psVar11 + 1);
            psVar9 = (stop_flag_t *)(ulong)uVar4;
          } while (psVar11 < psVar9);
        }
      } while (*piVar6 == 0);
    }
    close_all_listening_sockets((mg_context *)thread_func_param);
    pthread_mutex_lock((pthread_mutex_t *)((long)thread_func_param + 0x30));
    pthread_cond_broadcast((pthread_cond_t *)((long)thread_func_param + 0x88));
    pthread_mutex_unlock((pthread_mutex_t *)((long)thread_func_param + 0x30));
    uVar4 = *(uint *)((long)thread_func_param + 0x60);
    if ((ulong)uVar4 != 0) {
      uVar12 = 0;
      do {
        __th = *(pthread_t *)(*(long *)((long)thread_func_param + 0x68) + uVar12 * 8);
        if (__th != 0) {
          pthread_join(__th,(void **)0x0);
        }
        uVar12 = uVar12 + 1;
      } while (uVar4 != uVar12);
    }
    if (*(code **)((long)thread_func_param + 0x28390) != (code *)0x0) {
      (**(code **)((long)thread_func_param + 0x28390))(thread_func_param,0,local_118);
    }
    pthread_setspecific(sTlsKey,(void *)0x0);
    *piVar6 = 2;
  }
  return (void *)0x0;
}

Assistant:

static void *
master_thread(void *thread_func_param)
{
#if !defined(__ZEPHYR__)
	struct sigaction sa;

	/* Ignore SIGPIPE */
	memset(&sa, 0, sizeof(sa));
	sa.sa_handler = SIG_IGN;
	sigaction(SIGPIPE, &sa, NULL);
#endif

	master_thread_run((struct mg_context *)thread_func_param);
	return NULL;
}